

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O1

void __thiscall
btBU_Simplex1to4::getAabb
          (btBU_Simplex1to4 *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float extraout_XMM0_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  (*(this->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
    super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape
    [0xc])();
  fVar11 = (this->super_btPolyhedralConvexAabbCachingShape).m_localAabbMax.m_floats[0];
  fVar1 = (this->super_btPolyhedralConvexAabbCachingShape).m_localAabbMin.m_floats[0];
  fVar2 = (this->super_btPolyhedralConvexAabbCachingShape).m_localAabbMin.m_floats[1];
  fVar10 = (this->super_btPolyhedralConvexAabbCachingShape).m_localAabbMax.m_floats[1];
  fVar3 = (this->super_btPolyhedralConvexAabbCachingShape).m_localAabbMax.m_floats[2];
  fVar4 = (this->super_btPolyhedralConvexAabbCachingShape).m_localAabbMin.m_floats[2];
  fVar12 = (fVar11 - fVar1) * 0.5 + extraout_XMM0_Da;
  fVar13 = (fVar10 - fVar2) * 0.5 + extraout_XMM0_Da;
  fVar9 = (fVar3 - fVar4) * 0.5 + extraout_XMM0_Da;
  fVar14 = (fVar11 + fVar1) * 0.5;
  fVar17 = (fVar10 + fVar2) * 0.5;
  fVar16 = (fVar3 + fVar4) * 0.5;
  fVar10 = (t->m_basis).m_el[0].m_floats[0];
  fVar3 = (t->m_basis).m_el[0].m_floats[1];
  fVar4 = (t->m_basis).m_el[0].m_floats[2];
  fVar11 = (t->m_basis).m_el[2].m_floats[0];
  fVar1 = (t->m_basis).m_el[2].m_floats[1];
  fVar2 = (t->m_basis).m_el[2].m_floats[2];
  fVar18 = fVar16 * fVar2 + fVar14 * fVar11 + fVar17 * fVar1 + (t->m_origin).m_floats[2];
  fVar8 = ABS(fVar2) * fVar9 + ABS(fVar11) * fVar12 + ABS(fVar1) * fVar13;
  fVar11 = (t->m_basis).m_el[1].m_floats[0];
  fVar1 = (t->m_basis).m_el[1].m_floats[1];
  fVar2 = (t->m_basis).m_el[1].m_floats[2];
  uVar5 = *(undefined8 *)(t->m_origin).m_floats;
  fVar15 = (float)uVar5 + fVar16 * fVar4 + fVar14 * fVar10 + fVar17 * fVar3;
  fVar14 = (float)((ulong)uVar5 >> 0x20) + fVar16 * fVar2 + fVar14 * fVar11 + fVar17 * fVar1;
  fVar10 = fVar9 * ABS(fVar4) + fVar12 * ABS(fVar10) + fVar13 * ABS(fVar3);
  fVar11 = fVar9 * ABS(fVar2) + fVar12 * ABS(fVar11) + fVar13 * ABS(fVar1);
  auVar7._4_4_ = fVar14 - fVar11;
  auVar7._0_4_ = fVar15 - fVar10;
  auVar7._8_4_ = fVar18 - fVar8;
  auVar7._12_4_ = 0;
  *(undefined1 (*) [16])aabbMin->m_floats = auVar7;
  auVar6._4_4_ = fVar11 + fVar14;
  auVar6._0_4_ = fVar10 + fVar15;
  auVar6._8_4_ = fVar8 + fVar18;
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar6;
  return;
}

Assistant:

void btBU_Simplex1to4::getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
#if 1
	btPolyhedralConvexAabbCachingShape::getAabb(t,aabbMin,aabbMax);
#else
	aabbMin.setValue(BT_LARGE_FLOAT,BT_LARGE_FLOAT,BT_LARGE_FLOAT);
	aabbMax.setValue(-BT_LARGE_FLOAT,-BT_LARGE_FLOAT,-BT_LARGE_FLOAT);

	//just transform the vertices in worldspace, and take their AABB
	for (int i=0;i<m_numVertices;i++)
	{
		btVector3 worldVertex = t(m_vertices[i]);
		aabbMin.setMin(worldVertex);
		aabbMax.setMax(worldVertex);
	}
#endif
}